

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shk.c
# Opt level: O0

int shop_item_cost(obj *obj)

{
  level *lev;
  boolean bVar1;
  int iVar2;
  char *pcVar3;
  long lVar4;
  int local_38;
  int local_28;
  xchar local_22;
  xchar local_21;
  int cost;
  xchar y;
  xchar x;
  monst *shkp;
  obj *obj_local;
  
  local_28 = 0;
  shkp = (monst *)obj;
  bVar1 = get_obj_location(obj,&local_21,&local_22,0);
  if ((bVar1 != '\0') &&
     (((*(uint *)(shkp->mtrack + 3) >> 2 & 1) != 0 ||
      (((shkp->mtrack[2].x == '\x01' && ((*(uint *)(shkp->mtrack + 3) >> 3 & 1) == 0)) &&
       (bVar1 = costly_spot(local_21,local_22), bVar1 != '\0')))))) {
    lev = (level *)shkp->mw;
    pcVar3 = in_rooms((level *)shkp->mw,local_21,local_22,0x12);
    _cost = shop_keeper(lev,*pcVar3);
    if (_cost == (monst *)0x0) {
      return 0;
    }
    iVar2 = inhishop(_cost);
    if (iVar2 == 0) {
      return 0;
    }
    bVar1 = costly_spot(local_21,local_22);
    if (bVar1 == '\0') {
      return 0;
    }
    if (u.ushops[0] == '\0') {
      return 0;
    }
    if (*(char *)((long)&shkp->mspec_used + 1) != '\f') {
      if ((shkp == (monst *)uball) || (shkp == (monst *)uchain)) {
        local_38 = 0;
      }
      else {
        local_38 = shkp->mhpmax;
        lVar4 = get_cost((obj *)shkp,_cost);
        local_38 = local_38 * (int)lVar4;
      }
      local_28 = local_38;
      if (shkp->dlevel != (level *)0x0) {
        lVar4 = contained_cost((obj *)shkp,_cost,0,'\0','\0');
        local_28 = local_38 + (int)lVar4;
      }
    }
  }
  return local_28;
}

Assistant:

int shop_item_cost(const struct obj *obj)
{
	struct monst *shkp;
	xchar x, y;
	int cost=0;

	if (get_obj_location(obj, &x, &y, 0) && (obj->unpaid ||
	    (obj->where==OBJ_FLOOR && !obj->no_charge && costly_spot(x,y)))) {
		if (!(shkp = shop_keeper(obj->olev, *in_rooms(obj->olev, x, y, SHOPBASE)))) return 0;
		if (!inhishop(shkp)) return 0;
		if (!costly_spot(x, y)) return 0;
		if (!*u.ushops) return 0;

		if (obj->oclass != COIN_CLASS) {
			cost = (obj == uball || obj == uchain) ? 0L :
				obj->quan * get_cost(obj, shkp);
			if (Has_contents(obj))
				cost += contained_cost(obj, shkp, 0L, FALSE, FALSE);
		}
	}
	return cost;
}